

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_8::TwoLevelIterator::status(TwoLevelIterator *this)

{
  bool bVar1;
  Iterator *pIVar2;
  Status *in_RSI;
  Status *in_RDI;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  byte bVar3;
  byte bVar4;
  Status *rhs;
  Status local_20;
  Status local_18 [3];
  
  rhs = in_RDI;
  IteratorWrapper::status
            ((IteratorWrapper *)
             CONCAT17(in_stack_ffffffffffffffbf,
                      CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
  bVar1 = Status::ok(local_18);
  Status::~Status(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pIVar2 = IteratorWrapper::iter((IteratorWrapper *)(in_RSI + 0xf));
    bVar3 = 0;
    bVar4 = bVar3;
    if (pIVar2 != (Iterator *)0x0) {
      IteratorWrapper::status
                ((IteratorWrapper *)
                 (ulong)CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8));
      bVar1 = Status::ok(&local_20);
      bVar3 = bVar1 ^ 0xff;
      bVar4 = bVar3;
      Status::~Status(in_RDI);
    }
    if ((bVar3 & 1) == 0) {
      Status::Status(in_RSI,rhs);
    }
    else {
      IteratorWrapper::status
                ((IteratorWrapper *)CONCAT17(bVar4,CONCAT16(bVar3,in_stack_ffffffffffffffb8)));
    }
  }
  else {
    IteratorWrapper::status
              ((IteratorWrapper *)
               CONCAT17(in_stack_ffffffffffffffbf,
                        CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
  }
  return (Status)(char *)rhs;
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }